

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::EncodeDecodeTest_DecodeDeterministicOutput_Test::
TestBody(EncodeDecodeTest_DecodeDeterministicOutput_Test *this)

{
  bool bVar1;
  string *filename;
  char *in_R9;
  string_view expected_text;
  AssertHelper local_c0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b8;
  char *local_b0;
  string local_98;
  string golden_path;
  AssertionResult gtest_ar_;
  
  TestTempDir_abi_cxx11_();
  filename = &local_98;
  local_98._M_dataplus._M_p = local_b0;
  local_98._M_string_length = (size_type)local_b8._M_head_impl;
  gtest_ar_ = (AssertionResult)absl::lts_20250127::NullSafeStringView("/golden_message");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&golden_path,(lts_20250127 *)filename,(AlphaNum *)&gtest_ar_,(AlphaNum *)&gtest_ar_);
  std::__cxx11::string::~string((string *)&local_b8);
  WriteGoldenMessage(&golden_path);
  EncodeDecodeTest::RedirectStdinFromFile((EncodeDecodeTest *)&golden_path,filename);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,
             "google/protobuf/unittest.proto --decode=proto2_unittest.TestAllTypes --deterministic_output"
             ,(allocator<char> *)&local_b8);
  bVar1 = EncodeDecodeTest::Run(&this->super_EncodeDecodeTest,&local_98,true);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  std::__cxx11::string::~string((string *)&local_98);
  if (bVar1) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&gtest_ar_,
               (AssertionResult *)
               "Run(\"google/protobuf/unittest.proto\" \" --decode=proto2_unittest.TestAllTypes --deterministic_output\")"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
               ,0x1219,local_98._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    std::__cxx11::string::~string((string *)&local_98);
    if (local_b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  expected_text._M_str = "Can only use --deterministic_output with --encode.";
  expected_text._M_len = 0x32;
  EncodeDecodeTest::ExpectError(&this->super_EncodeDecodeTest,expected_text);
  std::__cxx11::string::~string((string *)&golden_path);
  return;
}

Assistant:

TEST_P(EncodeDecodeTest, DecodeDeterministicOutput) {
  std::string golden_path = absl::StrCat(TestTempDir(), "/golden_message");
  WriteGoldenMessage(golden_path);
  RedirectStdinFromFile(golden_path);
  EXPECT_FALSE(
      Run("google/protobuf/unittest.proto"
          " --decode=proto2_unittest.TestAllTypes --deterministic_output"));
  ExpectError("Can only use --deterministic_output with --encode.");
}